

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

int cmcmd_cmake_ninja_depends(const_iterator argBeg,const_iterator argEnd)

{
  _Alloc_hider m2;
  bool bVar1;
  int iVar2;
  Value *pVVar3;
  Value *this;
  ostream *poVar4;
  _Base_ptr p_Var5;
  const_iterator cVar6;
  uint uVar7;
  char *pcVar8;
  string *this_00;
  const_iterator cVar9;
  Value ddi;
  string arg_pp;
  string arg_ddi;
  string arg_tdi;
  string arg_obj;
  string arg_dep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  cmFortranSourceInfo info;
  cmGeneratedFileStream ddif;
  cmFortranParser parser;
  ValueHolder local_600;
  long local_5f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f0;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_538;
  undefined1 local_518 [32];
  _Base_ptr local_4f8;
  size_t local_4f0;
  ValueHolder local_4e8;
  undefined8 local_4e0;
  undefined1 local_4d8 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  _Rb_tree_node_base local_490;
  undefined8 local_470;
  _Rb_tree_node_base local_460;
  undefined8 local_440;
  Value local_438;
  Value local_410;
  Value local_3e8;
  ValueHolder local_3c0;
  undefined1 local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  byte abStack_3a0 [552];
  undefined1 local_178 [24];
  _Elt_pointer local_160;
  
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  local_598._M_string_length = 0;
  local_598.field_2._M_local_buf[0] = '\0';
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  local_5d8._M_string_length = 0;
  local_5d8.field_2._M_local_buf[0] = '\0';
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  local_558._M_string_length = 0;
  local_558.field_2._M_local_buf[0] = '\0';
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  local_578._M_string_length = 0;
  local_578.field_2._M_local_buf[0] = '\0';
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  local_5b8._M_string_length = 0;
  local_5b8.field_2._M_local_buf[0] = '\0';
  pcVar8 = "-E cmake_ninja_depends requires value for --tdi=";
  if (argBeg._M_current != argEnd._M_current) {
    do {
      pcVar8 = ((argBeg._M_current)->_M_dataplus)._M_p;
      iVar2 = strncmp(pcVar8,"--tdi=",6);
      if (iVar2 == 0) {
        std::__cxx11::string::substr((ulong)&local_3c0,(ulong)argBeg._M_current);
        this_00 = &local_598;
      }
      else {
        iVar2 = strncmp(pcVar8,"--pp=",5);
        if (iVar2 == 0) {
          std::__cxx11::string::substr((ulong)&local_3c0,(ulong)argBeg._M_current);
          this_00 = &local_5d8;
        }
        else {
          iVar2 = strncmp(pcVar8,"--dep=",6);
          if (iVar2 == 0) {
            std::__cxx11::string::substr((ulong)&local_3c0,(ulong)argBeg._M_current);
            this_00 = &local_558;
          }
          else {
            iVar2 = strncmp(pcVar8,"--obj=",6);
            if (iVar2 == 0) {
              std::__cxx11::string::substr((ulong)&local_3c0,(ulong)argBeg._M_current);
              this_00 = &local_578;
            }
            else {
              iVar2 = strncmp(pcVar8,"--ddi=",6);
              if (iVar2 != 0) {
                uVar7 = 1;
                cmSystemTools::Error
                          ("-E cmake_ninja_depends unknown argument: ",pcVar8,(char *)0x0,
                           (char *)0x0);
                goto LAB_0042eddc;
              }
              std::__cxx11::string::substr((ulong)&local_3c0,(ulong)argBeg._M_current);
              this_00 = &local_5b8;
            }
          }
        }
      }
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_3c0.bool_);
      if (local_3c0 != &local_3b0) {
        operator_delete(local_3c0.string_,local_3b0._M_allocated_capacity + 1);
      }
      argBeg._M_current = argBeg._M_current + 1;
    } while (argBeg._M_current != argEnd._M_current);
    pcVar8 = "-E cmake_ninja_depends requires value for --tdi=";
    if (local_598._M_string_length != 0) {
      if (local_5d8._M_string_length == 0) {
        pcVar8 = "-E cmake_ninja_depends requires value for --pp=";
      }
      else if (local_558._M_string_length == 0) {
        pcVar8 = "-E cmake_ninja_depends requires value for --dep=";
      }
      else if (local_578._M_string_length == 0) {
        pcVar8 = "-E cmake_ninja_depends requires value for --obj=";
      }
      else {
        if (local_5b8._M_string_length != 0) {
          local_538.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_538.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_538.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Json::Value::Value((Value *)&local_4e8,nullValue);
          std::ifstream::ifstream(&local_3c0,local_598._M_dataplus._M_p,_S_in|_S_bin);
          Json::Reader::Reader((Reader *)local_178);
          bVar1 = Json::Reader::parse((Reader *)local_178,(istream *)&local_3c0.bool_,
                                      (Value *)&local_4e8,false);
          m2._M_p = local_598._M_dataplus._M_p;
          if (bVar1) {
            Json::Reader::~Reader((Reader *)local_178);
            std::ifstream::~ifstream(&local_3c0);
            pVVar3 = Json::Value::operator[]((Value *)&local_4e8,"include-dirs");
            bVar1 = Json::Value::isArray(pVVar3);
            if (bVar1) {
              cVar9 = Json::Value::begin(pVVar3);
              local_178._0_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
              local_178[8] = cVar9.super_ValueIteratorBase.isNull_;
              while( true ) {
                cVar9 = Json::Value::end(pVVar3);
                local_3c0.int_ = (LargestInt)cVar9.super_ValueIteratorBase.current_._M_node;
                local_3b8 = cVar9.super_ValueIteratorBase.isNull_;
                bVar1 = Json::ValueIteratorBase::isEqual
                                  ((ValueIteratorBase *)local_178,(SelfType *)&local_3c0);
                if (bVar1) break;
                this = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_178);
                Json::Value::asString_abi_cxx11_((string *)&local_3c0,this);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_538,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_3c0);
                if (local_3c0 != &local_3b0) {
                  operator_delete(local_3c0.string_,local_3b0._M_allocated_capacity + 1);
                }
                Json::ValueIteratorBase::increment((ValueIteratorBase *)local_178);
              }
            }
            Json::Value::~Value((Value *)&local_4e8);
            local_4e8.string_ = local_4d8;
            local_4e0 = 0;
            local_4d8[0] = 0;
            local_4c8._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_4c8._M_impl.super__Rb_tree_header._M_header;
            local_4c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_4c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_4c8._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_490._M_left = &local_490;
            local_490._M_color = _S_red;
            local_490._M_parent = (_Base_ptr)0x0;
            local_470 = 0;
            local_460._M_color = _S_red;
            local_460._M_parent = (_Base_ptr)0x0;
            local_440 = 0;
            local_518._24_8_ = local_518 + 8;
            local_518._8_4_ = _S_red;
            local_518._16_8_ = 0;
            local_4f0 = 0;
            local_4f8 = (_Base_ptr)local_518._24_8_;
            local_4c8._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_4c8._M_impl.super__Rb_tree_header._M_header._M_left;
            local_490._M_right = local_490._M_left;
            local_460._M_left = &local_460;
            local_460._M_right = &local_460;
            cmFortranParser_s::cmFortranParser_s
                      ((cmFortranParser_s *)local_178,&local_538,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_518,(cmFortranSourceInfo *)&local_4e8);
            bVar1 = cmFortranParser_FilePush
                              ((cmFortranParser *)local_178,local_5d8._M_dataplus._M_p);
            if (bVar1) {
              iVar2 = cmFortran_yyparse(local_160);
              uVar7 = 1;
              if (iVar2 == 0) {
                cmGeneratedFileStream::cmGeneratedFileStream
                          ((cmGeneratedFileStream *)&local_3c0,local_558._M_dataplus._M_p,false,None
                          );
                cmsys::SystemTools::ConvertToUnixOutputPath((string *)&local_600,&local_5d8);
                poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&local_3c0,local_600.string_,local_5f8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
                if (local_600 != &local_5f0) {
                  operator_delete(local_600.string_,local_5f0._M_allocated_capacity + 1);
                }
                if (local_460._M_left != &local_460) {
                  p_Var5 = local_460._M_left;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_3c0," \\\n ",4);
                    cmsys::SystemTools::ConvertToUnixOutputPath
                              ((string *)&local_600,(string *)(p_Var5 + 1));
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_3c0,local_600.string_,local_5f8);
                    if (local_600 != &local_5f0) {
                      operator_delete(local_600.string_,local_5f0._M_allocated_capacity + 1);
                    }
                    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
                  } while (p_Var5 != &local_460);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3c0,"\n",1);
                cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_3c0);
                Json::Value::Value((Value *)&local_600,objectValue);
                Json::Value::Value(&local_3e8,&local_578);
                pVVar3 = Json::Value::operator[]((Value *)&local_600,"object");
                Json::Value::operator=(pVVar3,&local_3e8);
                Json::Value::~Value(&local_3e8);
                Json::Value::Value(&local_410,arrayValue);
                pVVar3 = Json::Value::operator[]((Value *)&local_600,"provides");
                pVVar3 = Json::Value::operator=(pVVar3,&local_410);
                Json::Value::~Value(&local_410);
                if ((_Rb_tree_header *)local_4c8._M_impl.super__Rb_tree_header._M_header._M_left !=
                    &local_4c8._M_impl.super__Rb_tree_header) {
                  p_Var5 = local_4c8._M_impl.super__Rb_tree_header._M_header._M_left;
                  do {
                    Json::Value::Value((Value *)&local_3c0,(string *)(p_Var5 + 1));
                    Json::Value::append(pVVar3,(Value *)&local_3c0);
                    Json::Value::~Value((Value *)&local_3c0);
                    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
                  } while ((_Rb_tree_header *)p_Var5 != &local_4c8._M_impl.super__Rb_tree_header);
                }
                Json::Value::Value(&local_438,arrayValue);
                pVVar3 = Json::Value::operator[]((Value *)&local_600,"requires");
                pVVar3 = Json::Value::operator=(pVVar3,&local_438);
                Json::Value::~Value(&local_438);
                if (local_490._M_left != &local_490) {
                  p_Var5 = local_490._M_left;
                  do {
                    cVar6 = std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::find(&local_4c8,(key_type *)(p_Var5 + 1));
                    if ((_Rb_tree_header *)cVar6._M_node == &local_4c8._M_impl.super__Rb_tree_header
                       ) {
                      Json::Value::Value((Value *)&local_3c0,(string *)(p_Var5 + 1));
                      Json::Value::append(pVVar3,(Value *)&local_3c0);
                      Json::Value::~Value((Value *)&local_3c0);
                    }
                    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
                  } while (p_Var5 != &local_490);
                }
                cmGeneratedFileStream::cmGeneratedFileStream
                          ((cmGeneratedFileStream *)&local_3c0,local_5b8._M_dataplus._M_p,false,None
                          );
                Json::operator<<((ostream *)&local_3c0,(Value *)&local_600);
                bVar1 = (abStack_3a0[*(long *)(local_3c0.int_ + -0x18)] & 5) != 0;
                if (bVar1) {
                  cmSystemTools::Error
                            ("-E cmake_ninja_depends failed to write ",local_5b8._M_dataplus._M_p,
                             (char *)0x0,(char *)0x0);
                }
                uVar7 = (uint)bVar1;
                cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_3c0);
                Json::Value::~Value((Value *)&local_600);
              }
            }
            else {
              uVar7 = 1;
              cmSystemTools::Error
                        ("-E cmake_ninja_depends failed to open ",local_5d8._M_dataplus._M_p,
                         (char *)0x0,(char *)0x0);
            }
            cmFortranParser_s::~cmFortranParser_s((cmFortranParser_s *)local_178);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_518);
            cmFortranSourceInfo::~cmFortranSourceInfo((cmFortranSourceInfo *)&local_4e8);
          }
          else {
            Json::Reader::getFormattedErrorMessages_abi_cxx11_
                      ((string *)local_518,(Reader *)local_178);
            cmSystemTools::Error
                      ("-E cmake_ninja_depends failed to parse ",m2._M_p,(char *)local_518._0_8_,
                       (char *)0x0);
            if ((undefined1 *)local_518._0_8_ != local_518 + 0x10) {
              operator_delete((void *)local_518._0_8_,local_518._16_8_ + 1);
            }
            Json::Reader::~Reader((Reader *)local_178);
            std::ifstream::~ifstream(&local_3c0);
            Json::Value::~Value((Value *)&local_4e8);
            uVar7 = 1;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_538);
          goto LAB_0042eddc;
        }
        pcVar8 = "-E cmake_ninja_depends requires value for --ddi=";
      }
    }
  }
  uVar7 = 1;
  cmSystemTools::Error(pcVar8,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_0042eddc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,
                    CONCAT71(local_5b8.field_2._M_allocated_capacity._1_7_,
                             local_5b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,
                    CONCAT71(local_578.field_2._M_allocated_capacity._1_7_,
                             local_578.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,
                    CONCAT71(local_558.field_2._M_allocated_capacity._1_7_,
                             local_558.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,
                    CONCAT71(local_5d8.field_2._M_allocated_capacity._1_7_,
                             local_5d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,
                    CONCAT71(local_598.field_2._M_allocated_capacity._1_7_,
                             local_598.field_2._M_local_buf[0]) + 1);
  }
  return uVar7;
}

Assistant:

int cmcmd_cmake_ninja_depends(std::vector<std::string>::const_iterator argBeg,
                              std::vector<std::string>::const_iterator argEnd)
{
  std::string arg_tdi;
  std::string arg_pp;
  std::string arg_dep;
  std::string arg_obj;
  std::string arg_ddi;
  for (std::vector<std::string>::const_iterator a = argBeg; a != argEnd; ++a) {
    std::string const& arg = *a;
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--pp=")) {
      arg_pp = arg.substr(5);
    } else if (cmHasLiteralPrefix(arg, "--dep=")) {
      arg_dep = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--obj=")) {
      arg_obj = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--ddi=")) {
      arg_ddi = arg.substr(6);
    } else {
      cmSystemTools::Error("-E cmake_ninja_depends unknown argument: ",
                           arg.c_str());
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --tdi=");
    return 1;
  }
  if (arg_pp.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --pp=");
    return 1;
  }
  if (arg_dep.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --dep=");
    return 1;
  }
  if (arg_obj.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --obj=");
    return 1;
  }
  if (arg_ddi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --ddi=");
    return 1;
  }

  std::vector<std::string> includes;
  {
    Json::Value tdio;
    Json::Value const& tdi = tdio;
    {
      cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
      Json::Reader reader;
      if (!reader.parse(tdif, tdio, false)) {
        cmSystemTools::Error("-E cmake_ninja_depends failed to parse ",
                             arg_tdi.c_str(),
                             reader.getFormattedErrorMessages().c_str());
        return 1;
      }
    }

    Json::Value const& tdi_include_dirs = tdi["include-dirs"];
    if (tdi_include_dirs.isArray()) {
      for (Json::Value::const_iterator i = tdi_include_dirs.begin();
           i != tdi_include_dirs.end(); ++i) {
        includes.push_back(i->asString());
      }
    }
  }

  cmFortranSourceInfo info;
  std::set<std::string> defines;
  cmFortranParser parser(includes, defines, info);
  if (!cmFortranParser_FilePush(&parser, arg_pp.c_str())) {
    cmSystemTools::Error("-E cmake_ninja_depends failed to open ",
                         arg_pp.c_str());
    return 1;
  }
  if (cmFortran_yyparse(parser.Scanner) != 0) {
    // Failed to parse the file.
    return 1;
  }

  {
    cmGeneratedFileStream depfile(arg_dep.c_str());
    depfile << cmSystemTools::ConvertToUnixOutputPath(arg_pp) << ":";
    for (std::set<std::string>::iterator i = info.Includes.begin();
         i != info.Includes.end(); ++i) {
      depfile << " \\\n " << cmSystemTools::ConvertToUnixOutputPath(*i);
    }
    depfile << "\n";
  }

  Json::Value ddi(Json::objectValue);
  ddi["object"] = arg_obj;

  Json::Value& ddi_provides = ddi["provides"] = Json::arrayValue;
  for (std::set<std::string>::iterator i = info.Provides.begin();
       i != info.Provides.end(); ++i) {
    ddi_provides.append(*i);
  }
  Json::Value& ddi_requires = ddi["requires"] = Json::arrayValue;
  for (std::set<std::string>::iterator i = info.Requires.begin();
       i != info.Requires.end(); ++i) {
    // Require modules not provided in the same source.
    if (!info.Provides.count(*i)) {
      ddi_requires.append(*i);
    }
  }

  cmGeneratedFileStream ddif(arg_ddi.c_str());
  ddif << ddi;
  if (!ddif) {
    cmSystemTools::Error("-E cmake_ninja_depends failed to write ",
                         arg_ddi.c_str());
    return 1;
  }
  return 0;
}